

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_js_api_json_autogen.h
# Opt level: O0

CoinSelectionFeeInformationField * __thiscall
cfd::js::api::json::CoinSelectionFeeInformationField::GetFeeAssetString_abi_cxx11_
          (CoinSelectionFeeInformationField *this,CoinSelectionFeeInformationField *obj)

{
  CoinSelectionFeeInformationField *obj_local;
  
  core::ConvertToString<std::__cxx11::string>((core *)this,&obj->fee_asset_);
  return this;
}

Assistant:

static std::string GetFeeAssetString(  // line separate
      const CoinSelectionFeeInformationField& obj) {  // NOLINT
    return cfd::core::ConvertToString(obj.fee_asset_);
  }